

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O1

void chaiscript::bootstrap::bootstrap_pod_type<signed_char>(string *name,Module *m)

{
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  pointer pcVar1;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> sStack_e8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Type_Info local_38;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + name->_M_string_length);
  local_38.m_type_info = (type_info *)&signed_char::typeinfo;
  local_38.m_bare_type_info = (type_info *)&signed_char::typeinfo;
  local_38.m_flags = 0x10;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  dispatch::detail::build_constructor_<signed_char>((_func_char *)&local_c8);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + name->_M_string_length);
  this = &m->m_funcs;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_c8.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  construct_pod<signed_char>(name,m);
  local_38.m_type_info = (type_info *)parse_string<signed_char>;
  dispatch::detail::
  make_callable_impl<signed_char(*)(std::__cxx11::string_const&),false,false,false,false,signed_char,std::__cxx11::string_const&>
            (&local_d8);
  std::operator+(&local_78,"to_",name);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d8,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_d8.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  dispatch::detail::
  make_callable_impl<chaiscript::bootstrap::bootstrap_pod_type<signed_char>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(signed_char)_1_,false,false,false,true,signed_char,signed_char>
            (&sStack_e8,&local_38);
  std::operator+(&local_98,"to_",name);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&sStack_e8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sStack_e8.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_e8.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void bootstrap_pod_type(const std::string &name, Module &m) {
    m.add(user_type<T>(), name);
    m.add(constructor<T()>(), name);
    construct_pod<T>(name, m);

    m.add(fun(&parse_string<T>), "to_" + name);
    m.add(fun([](const T t) { return t; }), "to_" + name);
  }